

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData160::Serialize(ByteData *__return_storage_ptr__,ByteData160 *this)

{
  size_type sVar1;
  uchar *buffer;
  undefined1 local_40 [8];
  Serializer obj;
  ByteData160 *this_local;
  
  obj._32_8_ = this;
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  Serializer::Serializer((Serializer *)local_40,(uint32_t)sVar1);
  buffer = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  sVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  Serializer::AddVariableBuffer((Serializer *)local_40,buffer,(uint32_t)sVar1);
  Serializer::Output(__return_storage_ptr__,(Serializer *)local_40);
  Serializer::~Serializer((Serializer *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ByteData ByteData160::Serialize() const {
  Serializer obj(static_cast<uint32_t>(data_.size()));
  obj.AddVariableBuffer(data_.data(), static_cast<uint32_t>(data_.size()));
  return obj.Output();
}